

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O1

void vsencoding::__vseblocks_unpack6(uint32_t *out,uint32_t *in,uint32_t bs)

{
  uint uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  uint32_t uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined8 uVar19;
  undefined1 auVar15 [32];
  
  if (0x1f < bs + 0x1f) {
    uVar9 = bs + 0x1f >> 5;
    auVar3 = vpmovsxbd_avx(ZEXT416(0x2080e14));
    auVar14._8_4_ = 0x3f;
    auVar14._0_8_ = 0x3f0000003f;
    auVar14._12_4_ = 0x3f;
    auVar15._16_4_ = 0x3f;
    auVar15._0_16_ = auVar14;
    auVar15._20_4_ = 0x3f;
    auVar15._24_4_ = 0x3f;
    auVar15._28_4_ = 0x3f;
    auVar4 = vpmovsxbd_avx(ZEXT416(0xa10161c));
    auVar5 = vpmovsxbd_avx(ZEXT416(0x60c1218));
    auVar6 = vpmovsxbd_avx(ZEXT416(0xe14));
    auVar7 = vpmovsxbd_avx(ZEXT416(0x208));
    auVar8 = vpmovsxbd_avx(ZEXT416(0xc12181e));
    do {
      uVar1 = *in;
      *out = uVar1 >> 0x1a;
      auVar11 = vpbroadcastd_avx512vl();
      auVar11 = vpsrlvd_avx2(auVar11,auVar3);
      auVar11 = vpand_avx(auVar11,auVar14);
      *(undefined1 (*) [16])(out + 1) = auVar11;
      uVar10 = (uVar1 & 3) << 4;
      out[5] = uVar10;
      uVar1 = in[1];
      auVar11 = vpbroadcastd_avx512vl();
      auVar12 = vpsrlvd_avx2(auVar11,auVar4);
      auVar11 = vpinsrd_avx(auVar14,uVar10,0);
      auVar13 = vpor_avx(auVar11,auVar12);
      auVar11 = vpand_avx(auVar12,auVar14);
      auVar11 = vpblendd_avx2(auVar11,auVar13,1);
      *(undefined1 (*) [16])(out + 5) = auVar11;
      out[9] = uVar1 >> 4 & 0x3f;
      out[10] = uVar1 * 4 & 0x3c;
      uVar2 = *(ulong *)(in + 2);
      out[10] = (uVar1 & 0xf) << 2 | (uint)uVar2 >> 0x1e;
      auVar11 = vpbroadcastd_avx512vl();
      auVar11 = vpsrlvd_avx2(auVar11,auVar5);
      auVar12 = vpbroadcastd_avx512vl();
      auVar13 = vpsrlvd_avx2(auVar12,auVar6);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar2;
      auVar17._0_16_ = ZEXT116(0) * auVar16 + ZEXT116(1) * auVar11;
      auVar17._16_16_ = ZEXT116(1) * auVar16;
      uVar19 = auVar13._0_8_;
      auVar18._8_8_ = uVar19;
      auVar18._0_8_ = uVar19;
      auVar18._16_8_ = uVar19;
      auVar18._24_8_ = uVar19;
      auVar18 = vpblendd_avx2(auVar17,auVar18,0xc0);
      auVar18 = vpand_avx2(auVar18,auVar15);
      auVar17 = vpsrld_avx2(auVar17,0x1a);
      auVar18 = vpblendd_avx2(auVar18,auVar17,0x20);
      *(undefined1 (*) [32])(out + 0xb) = auVar18;
      auVar11 = vpsrlvd_avx2(auVar12,auVar7);
      auVar11 = vpand_avx(auVar11,auVar14);
      *(long *)(out + 0x13) = auVar11._0_8_;
      uVar10 = ((uint)(uVar2 >> 0x20) & 3) << 4;
      out[0x15] = uVar10;
      uVar1 = in[4];
      auVar11 = vpbroadcastd_avx512vl();
      auVar12 = vpsrlvd_avx2(auVar11,auVar4);
      auVar11 = vpinsrd_avx(auVar14,uVar10,0);
      auVar13 = vpor_avx(auVar11,auVar12);
      auVar11 = vpand_avx(auVar12,auVar14);
      auVar11 = vpblendd_avx2(auVar11,auVar13,1);
      *(undefined1 (*) [16])(out + 0x15) = auVar11;
      out[0x19] = uVar1 >> 4 & 0x3f;
      uVar10 = (uVar1 & 0xf) << 2;
      out[0x1a] = uVar10;
      uVar1 = in[5];
      auVar13 = vpbroadcastd_avx512vl();
      auVar11 = vpinsrd_avx(auVar14,uVar10,0);
      auVar12 = vpsrlvd_avx2(auVar13,auVar8);
      auVar13 = vpor_avx(auVar11,auVar12);
      auVar11 = vpand_avx(auVar12,auVar14);
      auVar11 = vpblendd_avx2(auVar11,auVar13,1);
      *(undefined1 (*) [16])(out + 0x1a) = auVar11;
      out[0x1e] = uVar1 >> 6 & 0x3f;
      out[0x1f] = uVar1 & 0x3f;
      out = out + 0x20;
      in = in + 6;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  return;
}

Assistant:

void __vseblocks_unpack6(uint32_t *__restrict__ out,
                         const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 6, --bs) {
    out[0] = in[0] >> 26;
    out[1] = (in[0] >> 20) & 0x3f;
    out[2] = (in[0] >> 14) & 0x3f;
    out[3] = (in[0] >> 8) & 0x3f;
    out[4] = (in[0] >> 2) & 0x3f;
    out[5] = (in[0] << 4) & 0x3f;
    out[5] |= in[1] >> 28;
    out[6] = (in[1] >> 22) & 0x3f;
    out[7] = (in[1] >> 16) & 0x3f;
    out[8] = (in[1] >> 10) & 0x3f;
    out[9] = (in[1] >> 4) & 0x3f;
    out[10] = (in[1] << 2) & 0x3f;
    out[10] |= in[2] >> 30;
    out[11] = (in[2] >> 24) & 0x3f;
    out[12] = (in[2] >> 18) & 0x3f;
    out[13] = (in[2] >> 12) & 0x3f;
    out[14] = (in[2] >> 6) & 0x3f;
    out[15] = in[2] & 0x3f;
    out[16] = in[3] >> 26;
    out[17] = (in[3] >> 20) & 0x3f;
    out[18] = (in[3] >> 14) & 0x3f;
    out[19] = (in[3] >> 8) & 0x3f;
    out[20] = (in[3] >> 2) & 0x3f;
    out[21] = (in[3] << 4) & 0x3f;
    out[21] |= in[4] >> 28;
    out[22] = (in[4] >> 22) & 0x3f;
    out[23] = (in[4] >> 16) & 0x3f;
    out[24] = (in[4] >> 10) & 0x3f;
    out[25] = (in[4] >> 4) & 0x3f;
    out[26] = (in[4] << 2) & 0x3f;
    out[26] |= in[5] >> 30;
    out[27] = (in[5] >> 24) & 0x3f;
    out[28] = (in[5] >> 18) & 0x3f;
    out[29] = (in[5] >> 12) & 0x3f;
    out[30] = (in[5] >> 6) & 0x3f;
    out[31] = in[5] & 0x3f;
  }
}